

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

NFRule * __thiscall
icu_63::RuleBasedNumberFormat::initializeDefaultInfinityRule
          (RuleBasedNumberFormat *this,UErrorCode *status)

{
  UBool UVar1;
  DecimalFormatSymbols *this_00;
  NFRule *pNVar2;
  UnicodeString *srcText;
  NFRule *local_e8;
  LocalPointerBase<icu_63::NFRule> local_c0;
  LocalPointer<icu_63::NFRule> temp;
  ConstChar16Ptr local_68;
  undefined1 local_60 [8];
  UnicodeString rule;
  UErrorCode *status_local;
  RuleBasedNumberFormat *this_local;
  
  rule.fUnion._48_8_ = status;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (this->defaultInfinityRule == (NFRule *)0x0) {
      ConstChar16Ptr::ConstChar16Ptr(&local_68,L"Inf: ");
      UnicodeString::UnicodeString((UnicodeString *)local_60,'\x01',&local_68,-1);
      ConstChar16Ptr::~ConstChar16Ptr(&local_68);
      this_00 = getDecimalFormatSymbols(this);
      DecimalFormatSymbols::getSymbol((UnicodeString *)&temp,this_00,kInfinitySymbol);
      srcText = (UnicodeString *)&temp;
      UnicodeString::append((UnicodeString *)local_60,srcText);
      UnicodeString::~UnicodeString((UnicodeString *)&temp);
      pNVar2 = (NFRule *)UMemory::operator_new((UMemory *)0x70,(size_t)srcText);
      local_e8 = (NFRule *)0x0;
      if (pNVar2 != (NFRule *)0x0) {
        NFRule::NFRule(pNVar2,this,(UnicodeString *)local_60,(UErrorCode *)rule.fUnion._48_8_);
        local_e8 = pNVar2;
      }
      LocalPointer<icu_63::NFRule>::LocalPointer
                ((LocalPointer<icu_63::NFRule> *)&local_c0,local_e8,(UErrorCode *)rule.fUnion._48_8_
                );
      UVar1 = ::U_SUCCESS(*(UErrorCode *)rule.fUnion._48_8_);
      if (UVar1 != '\0') {
        pNVar2 = LocalPointerBase<icu_63::NFRule>::orphan(&local_c0);
        this->defaultInfinityRule = pNVar2;
      }
      LocalPointer<icu_63::NFRule>::~LocalPointer((LocalPointer<icu_63::NFRule> *)&local_c0);
      UnicodeString::~UnicodeString((UnicodeString *)local_60);
    }
    this_local = (RuleBasedNumberFormat *)this->defaultInfinityRule;
  }
  else {
    this_local = (RuleBasedNumberFormat *)0x0;
  }
  return (NFRule *)this_local;
}

Assistant:

NFRule*
RuleBasedNumberFormat::initializeDefaultInfinityRule(UErrorCode &status)
{
    if (U_FAILURE(status)) {
        return nullptr;
    }
    if (defaultInfinityRule == NULL) {
        UnicodeString rule(UNICODE_STRING_SIMPLE("Inf: "));
        rule.append(getDecimalFormatSymbols()->getSymbol(DecimalFormatSymbols::kInfinitySymbol));
        LocalPointer<NFRule> temp(new NFRule(this, rule, status), status);
        if (U_SUCCESS(status)) {
            defaultInfinityRule = temp.orphan();
        }
    }
    return defaultInfinityRule;
}